

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatterATT.c
# Opt level: O1

ZyanStatus
ZydisFormatterATTFormatInstruction
          (ZydisFormatter *formatter,ZydisFormatterBuffer *buffer,ZydisFormatterContext *context)

{
  void **ppvVar1;
  ZyanBool ZVar2;
  char cVar3;
  int iVar4;
  ZydisDecodedOperand *pZVar5;
  void *pvVar6;
  byte bVar7;
  ZyanStatus ZVar8;
  ZyanStatus ZVar9;
  ZyanStatus ZVar10;
  void *pvVar11;
  ulong uVar12;
  ZydisFormatterFunc *pp_Var13;
  long lVar14;
  ZyanUSize ZVar15;
  void *state;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  bool bVar19;
  bool bVar20;
  
  if (formatter == (ZydisFormatter *)0x0) {
    __assert_fail("formatter",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterATT.c"
                  ,0x2e,
                  "ZyanStatus ZydisFormatterATTFormatInstruction(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (buffer == (ZydisFormatterBuffer *)0x0) {
    __assert_fail("buffer",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterATT.c"
                  ,0x2f,
                  "ZyanStatus ZydisFormatterATTFormatInstruction(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (context == (ZydisFormatterContext *)0x0) {
    __assert_fail("context",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterATT.c"
                  ,0x30,
                  "ZyanStatus ZydisFormatterATTFormatInstruction(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (context->instruction == (ZydisDecodedInstruction *)0x0) {
    __assert_fail("context->instruction",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterATT.c"
                  ,0x31,
                  "ZyanStatus ZydisFormatterATTFormatInstruction(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (context->operands == (ZydisDecodedOperand *)0x0) {
    __assert_fail("context->operands",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterATT.c"
                  ,0x32,
                  "ZyanStatus ZydisFormatterATTFormatInstruction(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  ZVar8 = (*formatter->func_print_prefixes)(formatter,buffer,context);
  ZVar9 = ZVar8;
  if ((-1 < (int)ZVar8) &&
     (ZVar9 = (*formatter->func_print_mnemonic)(formatter,buffer,context), -1 < (int)ZVar9)) {
    if (buffer->is_token_list == '\0') {
      pvVar11 = (void *)(buffer->string).vector.size;
    }
    else {
      pvVar11 = (buffer->string).vector.data;
    }
    bVar7 = context->instruction->operand_count_visible - 1;
    if (-1 < (char)bVar7) {
      lVar18 = (ulong)bVar7 * 0x50;
      uVar16 = (ulong)bVar7 + 1;
      do {
        pZVar5 = context->operands;
        if (((uVar16 != 2) || (*(int *)((long)&pZVar5->type + lVar18) != 1)) ||
           (bVar19 = false, *(int *)((long)&pZVar5->encoding + lVar18) != 6)) {
          ZVar2 = buffer->is_token_list;
          if (ZVar2 == '\0') {
            state = (void *)(buffer->string).vector.size;
          }
          else {
            state = (buffer->string).vector.data;
          }
          if (state == pvVar11) {
            if (ZVar2 == '\0') {
              if ((buffer->string).vector.allocator != (ZyanAllocator *)0x0) {
LAB_0010f69a:
                __assert_fail("!destination->vector.allocator",
                              "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                              ,0xeb,
                              "ZyanStatus ZydisStringAppendShort(ZyanString *, const ZydisShortString *)"
                             );
              }
              ZVar15 = (buffer->string).vector.size;
              if (ZVar15 == 0) {
LAB_0010f6b9:
                __assert_fail("destination->vector.size && source->size",
                              "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                              ,0xec,
                              "ZyanStatus ZydisStringAppendShort(ZyanString *, const ZydisShortString *)"
                             );
              }
              uVar17 = ZVar15 + 1;
              uVar12 = (buffer->string).vector.capacity;
              ZVar9 = 0x80100009;
              if (uVar17 <= uVar12) {
                *(undefined2 *)((long)(buffer->string).vector.data + (ZVar15 - 1)) = 0x20;
                ZVar15 = (buffer->string).vector.size;
                pvVar6 = (buffer->string).vector.data;
                (buffer->string).vector.size = ZVar15 + 1;
                cVar3 = *(char *)((long)pvVar6 + ZVar15);
LAB_0010f2e8:
                ZVar9 = ZVar8;
                if (cVar3 != '\0') {
                  __assert_fail("*(char*)((ZyanU8*)(destination)->vector.data + (destination)->vector.size - 1) == \'\\0\'"
                                ,
                                "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                                ,0xf7,
                                "ZyanStatus ZydisStringAppendShort(ZyanString *, const ZydisShortString *)"
                               );
                }
              }
              goto LAB_0010f2f1;
            }
            ZVar15 = (buffer->string).vector.size;
            if (0xfe < ZVar15 - 1) {
LAB_0010f67b:
              __assert_fail("(len > 0) && (len < 256)",
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/FormatterBase.h"
                            ,0xe7,
                            "ZyanStatus ZydisFormatterBufferAppendPredefined(ZydisFormatterBuffer *, const ZydisPredefinedToken *)"
                           );
            }
            uVar12 = buffer->capacity;
            uVar17 = ZVar15 + 4;
            ZVar9 = 0x80100009;
            if (uVar17 < uVar12) {
              pvVar6 = (buffer->string).vector.data;
              *(char *)((long)pvVar6 + -1) = (char)ZVar15;
              *(undefined4 *)((long)pvVar6 + ZVar15) = 0x200001;
              lVar14 = ZVar15 + 2;
LAB_0010f20e:
              ZVar15 = buffer->capacity - lVar14;
              buffer->capacity = ZVar15;
              ppvVar1 = &(buffer->string).vector.data;
              *ppvVar1 = (void *)((long)*ppvVar1 + lVar14);
              (buffer->string).vector.size = 2;
              if (0xfe < ZVar15) {
                ZVar15 = 0xff;
              }
              (buffer->string).vector.capacity = ZVar15;
              ZVar9 = ZVar8;
            }
LAB_0010f238:
            bVar19 = true;
            ZVar8 = ZVar9;
            if (uVar12 <= uVar17) goto LAB_0010f3b0;
          }
          else {
            if (ZVar2 != '\0') {
              ZVar15 = (buffer->string).vector.size;
              if (0xfe < ZVar15 - 1) goto LAB_0010f67b;
              uVar12 = buffer->capacity;
              uVar17 = ZVar15 + 8;
              ZVar9 = 0x80100009;
              if (uVar17 < uVar12) {
                pvVar6 = (buffer->string).vector.data;
                *(char *)((long)pvVar6 + -1) = (char)ZVar15;
                *(undefined8 *)((long)pvVar6 + ZVar15) = 0x200001002c0202;
                lVar14 = ZVar15 + 6;
                goto LAB_0010f20e;
              }
              goto LAB_0010f238;
            }
            if ((buffer->string).vector.allocator != (ZyanAllocator *)0x0) goto LAB_0010f69a;
            ZVar15 = (buffer->string).vector.size;
            if (ZVar15 == 0) goto LAB_0010f6b9;
            uVar17 = ZVar15 + 2;
            uVar12 = (buffer->string).vector.capacity;
            ZVar9 = 0x80100009;
            if (uVar17 <= uVar12) {
              pvVar6 = (buffer->string).vector.data;
              *(undefined1 *)((long)pvVar6 + ZVar15 + 1) = 0;
              *(undefined2 *)((long)pvVar6 + (ZVar15 - 1)) = 0x202c;
              ZVar15 = (buffer->string).vector.size;
              pvVar6 = (buffer->string).vector.data;
              (buffer->string).vector.size = ZVar15 + 2;
              cVar3 = *(char *)((long)pvVar6 + ZVar15 + 1);
              goto LAB_0010f2e8;
            }
LAB_0010f2f1:
            bVar19 = true;
            ZVar8 = ZVar9;
            if (uVar12 < uVar17) goto LAB_0010f3b0;
          }
          context->operand = (ZydisDecodedOperand *)(&pZVar5->id + lVar18);
          if (formatter->func_pre_operand == (ZydisFormatterFunc)0x0) {
LAB_0010f33c:
            pp_Var13 = &formatter->func_format_operand_reg;
            switch(*(undefined4 *)((long)&pZVar5->type + lVar18)) {
            case 1:
              break;
            case 2:
              pp_Var13 = &formatter->func_format_operand_mem;
              break;
            case 3:
              pp_Var13 = &formatter->func_format_operand_ptr;
              break;
            case 4:
              pp_Var13 = &formatter->func_format_operand_imm;
              break;
            default:
              bVar19 = true;
              ZVar8 = 0x80100004;
              goto LAB_0010f3b0;
            }
            ZVar8 = (**pp_Var13)(formatter,buffer,context);
            if (ZVar8 == 0x20000b) {
LAB_0010f383:
              ZVar10 = ZydisFormatterBufferRestore(buffer,(ZyanUPointer)state);
              bVar19 = (int)ZVar10 < 0;
              ZVar8 = ZVar9;
              if (bVar19) {
                ZVar8 = ZVar10;
              }
            }
            else {
              if ((int)ZVar8 < 0) {
                bVar19 = true;
                goto LAB_0010f3b0;
              }
              if (formatter->func_post_operand != (ZydisFormatterFunc)0x0) {
                ZVar8 = (*formatter->func_post_operand)(formatter,buffer,context);
                if (ZVar8 == 0x20000b) goto LAB_0010f383;
                if (-1 < (int)ZVar8) goto LAB_0010f402;
              }
              if ((context->instruction->encoding & ~ZYDIS_INSTRUCTION_ENCODING_3DNOW) !=
                  ZYDIS_INSTRUCTION_ENCODING_EVEX) goto LAB_0010f530;
              if (((uVar16 == 1) && (1 < context->instruction->operand_count_visible)) &&
                 (context->operands[1].encoding == ZYDIS_OPERAND_ENCODING_MASK)) {
                bVar19 = true;
                ZVar8 = (*formatter->func_print_decorator)
                                  (formatter,buffer,context,ZYDIS_DECORATOR_MASK);
                if ((int)ZVar8 < 0) goto LAB_0010f3b0;
              }
              iVar4 = *(int *)((long)&pZVar5->type + lVar18);
              if (iVar4 == 2) {
                ZVar8 = (*formatter->func_print_decorator)
                                  (formatter,buffer,context,ZYDIS_DECORATOR_BC);
                if ((int)ZVar8 < 0) {
                  bVar19 = true;
                }
                else {
                  if (context->instruction->encoding != ZYDIS_INSTRUCTION_ENCODING_MAX_VALUE)
                  goto LAB_0010f530;
                  ZVar8 = (*formatter->func_print_decorator)
                                    (formatter,buffer,context,ZYDIS_DECORATOR_CONVERSION);
                  if ((int)ZVar8 < 0) {
                    bVar19 = true;
                  }
                  else {
                    ZVar8 = (*formatter->func_print_decorator)
                                      (formatter,buffer,context,ZYDIS_DECORATOR_EH);
                    bVar19 = true;
                    if (-1 < (int)ZVar8) goto LAB_0010f530;
                  }
                }
              }
              else {
                bVar7 = context->instruction->operand_count_visible;
                if ((int)uVar16 + -1 == bVar7 - 1) {
                  bVar19 = iVar4 != 4;
LAB_0010f551:
                  bVar20 = true;
                  if (bVar19) {
LAB_0010f581:
                    if ((context->instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_MAX_VALUE) &&
                       (ZVar8 = (*formatter->func_print_decorator)
                                          (formatter,buffer,context,ZYDIS_DECORATOR_SWIZZLE),
                       (int)ZVar8 < 0)) {
                      bVar20 = false;
                      ZVar9 = ZVar8;
                    }
                    else {
                      ZVar8 = (*formatter->func_print_decorator)
                                        (formatter,buffer,context,ZYDIS_DECORATOR_RC);
                      if ((int)ZVar8 < 0) {
                        bVar20 = false;
                        ZVar9 = ZVar8;
                      }
                      else {
                        ZVar8 = (*formatter->func_print_decorator)
                                          (formatter,buffer,context,ZYDIS_DECORATOR_SAE);
                        bVar20 = -1 < (int)ZVar8;
                        if (!bVar20) {
                          ZVar9 = ZVar8;
                        }
                      }
                    }
                  }
                }
                else {
                  bVar20 = true;
                  if ((int)uVar16 < (int)(uint)bVar7) {
                    if (context->operands[uVar16 & 0xffffffff].type != ZYDIS_OPERAND_TYPE_IMMEDIATE)
                    {
                      bVar19 = context->operands[uVar16 & 0xffffffff].visibility ==
                               ZYDIS_OPERAND_VISIBILITY_HIDDEN;
                      goto LAB_0010f551;
                    }
                    goto LAB_0010f581;
                  }
                }
                bVar19 = true;
                ZVar8 = ZVar9;
                if (bVar20) {
LAB_0010f530:
                  bVar19 = false;
                  ZVar8 = ZVar9;
                }
              }
            }
          }
          else {
            ZVar8 = (*formatter->func_pre_operand)(formatter,buffer,context);
            if (ZVar8 == 0x20000b) goto LAB_0010f383;
            if (-1 < (int)ZVar8) goto LAB_0010f33c;
LAB_0010f402:
            bVar19 = true;
          }
        }
LAB_0010f3b0:
        if (bVar19) {
          return ZVar8;
        }
        lVar18 = lVar18 + -0x50;
        uVar17 = uVar16 - 1;
        bVar19 = 0 < (long)uVar16;
        uVar16 = uVar17;
      } while (uVar17 != 0 && bVar19);
    }
    ZVar9 = 0x100000;
  }
  return ZVar9;
}

Assistant:

ZyanStatus ZydisFormatterATTFormatInstruction(const ZydisFormatter* formatter,
    ZydisFormatterBuffer* buffer, ZydisFormatterContext* context)
{
    ZYAN_ASSERT(formatter);
    ZYAN_ASSERT(buffer);
    ZYAN_ASSERT(context);
    ZYAN_ASSERT(context->instruction);
    ZYAN_ASSERT(context->operands);

    ZYAN_CHECK(formatter->func_print_prefixes(formatter, buffer, context));
    ZYAN_CHECK(formatter->func_print_mnemonic(formatter, buffer, context));

    ZyanUPointer state_mnemonic;
    ZYDIS_BUFFER_REMEMBER(buffer, state_mnemonic);

    const ZyanI8 c = (ZyanI8)context->instruction->operand_count_visible - 1;
    for (ZyanI8 i = c; i >= 0; --i)
    {
        const ZydisDecodedOperand* const operand = &context->operands[i];

        // Print embedded-mask registers as decorator instead of a regular operand
        if ((i == 1) && (operand->type == ZYDIS_OPERAND_TYPE_REGISTER) &&
            (operand->encoding == ZYDIS_OPERAND_ENCODING_MASK))
        {
            continue;
        }

        ZyanUPointer buffer_state;
        ZYDIS_BUFFER_REMEMBER(buffer, buffer_state);

        if (buffer_state != state_mnemonic)
        {
            ZYDIS_BUFFER_APPEND(buffer, DELIM_OPERAND);
        } else
        {
            ZYDIS_BUFFER_APPEND(buffer, DELIM_MNEMONIC);
        }

        // Set current operand
        context->operand = operand;

        ZyanStatus status;
        if (formatter->func_pre_operand)
        {
            status = formatter->func_pre_operand(formatter, buffer, context);
            if (status == ZYDIS_STATUS_SKIP_TOKEN)
            {
                ZYAN_CHECK(ZydisFormatterBufferRestore(buffer, buffer_state));
                continue;
            }
            if (!ZYAN_SUCCESS(status))
            {
                return status;
            }
        }

        switch (operand->type)
        {
        case ZYDIS_OPERAND_TYPE_REGISTER:
            status = formatter->func_format_operand_reg(formatter, buffer, context);
            break;
        case ZYDIS_OPERAND_TYPE_MEMORY:
            status = formatter->func_format_operand_mem(formatter, buffer, context);
            break;
        case ZYDIS_OPERAND_TYPE_POINTER:
            status = formatter->func_format_operand_ptr(formatter, buffer, context);
            break;
        case ZYDIS_OPERAND_TYPE_IMMEDIATE:
            status = formatter->func_format_operand_imm(formatter, buffer, context);
            break;
        default:
            return ZYAN_STATUS_INVALID_ARGUMENT;
        }
        if (status == ZYDIS_STATUS_SKIP_TOKEN)
        {
            ZYAN_CHECK(ZydisFormatterBufferRestore(buffer, buffer_state));
            continue;
        }
        if (!ZYAN_SUCCESS(status))
        {
            return status;
        }

        if (formatter->func_post_operand)
        {
            status = formatter->func_post_operand(formatter, buffer, context);
            if (status == ZYDIS_STATUS_SKIP_TOKEN)
            {
                ZYAN_CHECK(ZydisFormatterBufferRestore(buffer, buffer_state));
                continue;
            }
            if (ZYAN_SUCCESS(status))
            {
                return status;
            }
        }

#if !defined(ZYDIS_DISABLE_AVX512) || !defined(ZYDIS_DISABLE_KNC)
        if ((context->instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_EVEX) ||
            (context->instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_MVEX))
        {
            if  ((i == 0) && 
                (context->instruction->operand_count_visible > 1) && 
                (context->operands[1].encoding == ZYDIS_OPERAND_ENCODING_MASK))
            {
                ZYAN_CHECK(formatter->func_print_decorator(formatter, buffer, context,
                    ZYDIS_DECORATOR_MASK));
            }
            if (operand->type == ZYDIS_OPERAND_TYPE_MEMORY)
            {
                ZYAN_CHECK(formatter->func_print_decorator(formatter, buffer, context,
                    ZYDIS_DECORATOR_BC));
                if (context->instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_MVEX)
                {
                    ZYAN_CHECK(formatter->func_print_decorator(formatter, buffer, context,
                        ZYDIS_DECORATOR_CONVERSION));
                    ZYAN_CHECK(formatter->func_print_decorator(formatter, buffer, context,
                        ZYDIS_DECORATOR_EH));
                }
            } else
            {
                ZyanBool decorate_operand;
                if (i == (context->instruction->operand_count_visible - 1))
                {
                    decorate_operand = operand->type != ZYDIS_OPERAND_TYPE_IMMEDIATE;
                }
                else
                {
                    decorate_operand =
                        (context->instruction->operand_count_visible > (i + 1)) &&
                        ((context->operands[i + 1].type == ZYDIS_OPERAND_TYPE_IMMEDIATE) ||
                        (context->operands[i + 1].visibility == ZYDIS_OPERAND_VISIBILITY_HIDDEN));
                }
                if (decorate_operand)
                {
                    if (context->instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_MVEX)
                    {
                        ZYAN_CHECK(formatter->func_print_decorator(formatter, buffer, context,
                            ZYDIS_DECORATOR_SWIZZLE));
                    }
                    ZYAN_CHECK(formatter->func_print_decorator(formatter, buffer, context,
                        ZYDIS_DECORATOR_RC));
                    ZYAN_CHECK(formatter->func_print_decorator(formatter, buffer, context,
                        ZYDIS_DECORATOR_SAE));
                }
            }
        }
#endif
    }

    return ZYAN_STATUS_SUCCESS;
}